

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_routing.c
# Opt level: O0

void olsrv2_routing_force_update(_Bool skip_wait)

{
  long lVar1;
  _Bool _Var2;
  _Bool _Var3;
  long *plVar4;
  long lVar5;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  _Bool splitv6;
  nhdp_domain *pnStack_60;
  _Bool splitv4;
  nhdp_domain *domain;
  _Bool skip_wait_local;
  
  if ((!_initiate_shutdown) && (!_freeze_routes)) {
    if (_rate_limit_timer._clock != 0) {
      if (!skip_wait) {
        _trigger_dijkstra = true;
        if (((&log_global_mask)[LOG_OLSRV2_ROUTING] & 1) == 0) {
          _trigger_dijkstra = true;
          return;
        }
        oonf_log(1,LOG_OLSRV2_ROUTING,"src/olsrv2/olsrv2/olsrv2_routing.c",0x13e,0,0,
                 "Delay Dijkstra");
        return;
      }
      oonf_timer_stop(&_rate_limit_timer);
    }
    if ((_update_ansn & 1U) != 0) {
      _ansn = _ansn + 1;
      _update_ansn = false;
      if (((&log_global_mask)[LOG_OLSRV2_ROUTING] & 1) != 0) {
        oonf_log(1,LOG_OLSRV2_ROUTING,"src/olsrv2/olsrv2/olsrv2_routing.c",0x147,0,0,
                 "Update ANSN to %u",_ansn);
      }
    }
    if (((&log_global_mask)[LOG_OLSRV2_ROUTING] & 1) != 0) {
      oonf_log(1,LOG_OLSRV2_ROUTING,"src/olsrv2/olsrv2/olsrv2_routing.c",0x14a,0,0,"Run Dijkstra");
    }
    plVar4 = (long *)nhdp_domain_get_list();
    plVar4 = (long *)*plVar4;
    while( true ) {
      pnStack_60 = (nhdp_domain *)(plVar4 + -0x54);
      lVar1 = plVar4[1];
      lVar5 = nhdp_domain_get_list();
      if (lVar1 == *(long *)(lVar5 + 8)) break;
      if ((_domain_changed[*(int *)((long)plVar4 + -0x26c)] & 1U) != 0) {
        _domain_changed[*(int *)((long)plVar4 + -0x26c)] = false;
        _prepare_routes(pnStack_60);
        _prepare_nodes();
        _Var2 = _check_ssnode_split(pnStack_60,2);
        _run_dijkstra(pnStack_60,2,true,(_Bool)((_Var2 ^ 0xffU) & 1));
        _Var3 = _check_ssnode_split(pnStack_60,10);
        _run_dijkstra(pnStack_60,10,true,(_Bool)((_Var3 ^ 0xffU) & 1));
        if ((_Var2) || (_Var3)) {
          _prepare_nodes();
          if (_Var2) {
            _run_dijkstra(pnStack_60,2,false,true);
          }
          if (_Var3) {
            _run_dijkstra(pnStack_60,10,false,true);
          }
        }
        _handle_nhdp_routes(pnStack_60);
        _process_dijkstra_result(pnStack_60);
      }
      plVar4 = (long *)*plVar4;
    }
    _process_kernel_queue();
    oonf_timer_set_ext(&_rate_limit_timer,1000,1000);
  }
  return;
}

Assistant:

void
olsrv2_routing_force_update(bool skip_wait) {
  struct nhdp_domain *domain;
  bool splitv4, splitv6;

  if (_initiate_shutdown || _freeze_routes) {
    /* no dijkstra anymore when in shutdown */
    return;
  }

  /* handle dijkstra rate limitation timer */
  if (oonf_timer_is_active(&_rate_limit_timer)) {
    if (!skip_wait) {
      /* trigger dijkstra later */
      _trigger_dijkstra = true;

      OONF_DEBUG(LOG_OLSRV2_ROUTING, "Delay Dijkstra");
      return;
    }
    oonf_timer_stop(&_rate_limit_timer);
  }

  if (_update_ansn) {
    _ansn++;
    _update_ansn = false;
    OONF_DEBUG(LOG_OLSRV2_ROUTING, "Update ANSN to %u", _ansn);
  }

  OONF_DEBUG(LOG_OLSRV2_ROUTING, "Run Dijkstra");

  list_for_each_element(nhdp_domain_get_list(), domain, _node) {
    /* check if dijkstra is necessary */
    if (!_domain_changed[domain->index]) {
      /* nothing to do for this domain */
      continue;
    }
    _domain_changed[domain->index] = false;

    /* initialize dijkstra specific fields */
    _prepare_routes(domain);
    _prepare_nodes();

    /* run IPv4 dijkstra (might be two times because of source-specific data) */
    splitv4 = _check_ssnode_split(domain, AF_INET);
    _run_dijkstra(domain, AF_INET, true, !splitv4);

    /* run IPv6 dijkstra (might be two times because of source-specific data) */
    splitv6 = _check_ssnode_split(domain, AF_INET6);
    _run_dijkstra(domain, AF_INET6, true, !splitv6);

    /* handle source-specific sub-topology if necessary */
    if (splitv4 || splitv6) {
      /* re-initialize dijkstra specific node fields */
      _prepare_nodes();

      if (splitv4) {
        _run_dijkstra(domain, AF_INET, false, true);
      }
      if (splitv6) {
        _run_dijkstra(domain, AF_INET6, false, true);
      }
    }

    /* check if direct one-hop routes are quicker */
    _handle_nhdp_routes(domain);

    /* update kernel routes */
    _process_dijkstra_result(domain);
  }

  _process_kernel_queue();

  /* make sure dijkstra is not called too often */
  oonf_timer_set(&_rate_limit_timer, OLSRv2_DIJKSTRA_RATE_LIMITATION);
}